

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int __thiscall ON_wString::Replace(ON_wString *this,wchar_t *token1,wchar_t *token2)

{
  wchar_t *pwVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  wchar_t wVar6;
  size_t sVar7;
  wchar_t *pwVar8;
  ON_Internal_Empty_wString *pOVar9;
  ulong uVar10;
  ON_wString *pOVar11;
  wchar_t wVar12;
  uint uVar13;
  ulong uVar14;
  wchar_t wVar15;
  int iVar16;
  wchar_t wVar17;
  ulong uVar18;
  int len;
  int i;
  ON_SimpleArray<int> n;
  wchar_t local_7c;
  int local_78;
  wchar_t local_74;
  ON_wString *local_70;
  ulong local_68;
  size_t local_60;
  wchar_t *local_58;
  ON_SimpleArray<int> local_50;
  size_t local_38;
  
  iVar16 = 0;
  if ((token1 != (wchar_t *)0x0) && (*token1 != L'\0')) {
    pwVar8 = L"";
    if (token2 != (wchar_t *)0x0) {
      pwVar8 = token2;
    }
    sVar7 = wcslen(token1);
    wVar15 = (wchar_t)sVar7;
    iVar16 = 0;
    if (L'\0' < wVar15) {
      local_60 = wcslen(pwVar8);
      pOVar9 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar9 = &empty_wstring;
      }
      local_7c = (pOVar9->header).string_length;
      iVar16 = 0;
      if (wVar15 <= local_7c) {
        local_50._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
        local_50.m_a = (int *)0x0;
        local_50.m_count = 0;
        local_50.m_capacity = 0;
        local_58 = pwVar8;
        ON_SimpleArray<int>::SetCapacity(&local_50,0x20);
        pwVar8 = this->m_s;
        local_78 = 0;
        if (wVar15 <= local_7c) {
          do {
            iVar16 = local_78;
            iVar5 = wcsncmp(pwVar8,token1,(ulong)(uint)(wVar15 & 0x7fffffff));
            if (iVar5 == 0) {
              ON_SimpleArray<int>::Append(&local_50,&local_78);
              local_78 = local_78 + wVar15;
              pwVar8 = pwVar8 + (uint)(wVar15 & 0x7fffffff);
            }
            else {
              pwVar8 = pwVar8 + 1;
              local_78 = iVar16 + 1;
            }
          } while (local_78 <= local_7c - wVar15);
        }
        sVar7 = local_60;
        iVar16 = local_50.m_count;
        uVar14 = local_50._16_8_ & 0xffffffff;
        wVar17 = (wchar_t)local_60;
        wVar12 = (wVar17 - wVar15) * local_50.m_count + local_7c;
        if (wVar12 == L'\0') {
          Destroy(this);
        }
        else {
          CopyArray(this);
          wVar6 = local_7c;
          if (local_7c < wVar12) {
            wVar6 = wVar12;
          }
          pwVar8 = ReserveArray(this,(long)wVar6);
          if (pwVar8 == (wchar_t *)0x0) {
            iVar16 = 0;
          }
          else {
            local_74 = wVar12;
            local_68 = uVar14;
            if (wVar15 < wVar17) {
              if (0 < iVar16) {
                uVar10 = 0;
                do {
                  local_50.m_a[uVar10] = local_50.m_a[uVar10] + wVar15;
                  uVar10 = uVar10 + 1;
                } while (uVar14 != uVar10);
              }
              if (0 < iVar16) {
                local_38 = (sVar7 & 0xffffffff) << 2;
                pOVar11 = this;
                wVar17 = local_7c;
                local_70 = this;
                do {
                  this = local_70;
                  uVar18 = (ulong)(uint)wVar17;
                  uVar10 = (ulong)(uint)wVar12;
                  wVar6 = local_50.m_a[uVar14 - 1];
                  if (wVar6 < wVar17) {
                    pwVar8 = pOVar11->m_s;
                    uVar10 = (ulong)wVar12;
                    uVar18 = (ulong)wVar17;
                    do {
                      lVar4 = uVar18 - 1;
                      uVar18 = uVar18 - 1;
                      pwVar8[uVar10 - 1] = pwVar8[lVar4];
                      uVar10 = uVar10 - 1;
                    } while ((long)wVar6 < (long)uVar18);
                  }
                  wVar12 = (int)uVar10 - (int)local_60;
                  wVar17 = (int)uVar18 - wVar15;
                  memcpy(local_70->m_s + wVar12,local_58,local_38);
                  bVar3 = 1 < (long)uVar14;
                  pOVar11 = this;
                  uVar14 = uVar14 - 1;
                } while (bVar3);
              }
            }
            else {
              uVar14 = (ulong)(uint)*local_50.m_a;
              ON_SimpleArray<int>::Append(&local_50,&local_7c);
              if (0 < iVar16) {
                local_70 = (ON_wString *)((ulong)(uint)(wVar17 & 0x7fffffff) << 2);
                uVar18 = 0;
                uVar10 = uVar14;
                do {
                  if (L'\0' < wVar17) {
                    memcpy(this->m_s + (int)uVar10,local_58,(size_t)local_70);
                    uVar10 = (ulong)(uint)((int)uVar10 + wVar17);
                  }
                  uVar13 = (int)uVar14 + wVar15;
                  uVar14 = (ulong)uVar13;
                  uVar2 = local_50.m_a[uVar18 + 1];
                  if ((int)uVar13 < (int)uVar2) {
                    pwVar8 = this->m_s;
                    uVar10 = (ulong)(int)uVar10;
                    uVar14 = (ulong)(int)uVar13;
                    do {
                      pwVar1 = pwVar8 + uVar14;
                      uVar14 = uVar14 + 1;
                      pwVar8[uVar10] = *pwVar1;
                      uVar10 = uVar10 + 1;
                    } while ((long)uVar14 < (long)(int)uVar2);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != local_68);
              }
            }
            pwVar8 = this->m_s;
            pOVar9 = (ON_Internal_Empty_wString *)(pwVar8 + -3);
            if (pwVar8 == (wchar_t *)0x0) {
              pOVar9 = &empty_wstring;
            }
            (pOVar9->header).string_length = local_74;
            pwVar8[local_74] = L'\0';
            iVar16 = (int)local_68;
          }
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&local_50);
      }
    }
  }
  return iVar16;
}

Assistant:

int ON_wString::Replace( const wchar_t* token1, const wchar_t* token2 )
{
  int count = 0;

  if ( 0 != token1 && 0 != token1[0] )
  {
    if ( 0 == token2 )
      token2 = L"";
    const int len1 = (int)wcslen(token1);
    if ( len1 > 0 )
    {
      const int len2 = (int)wcslen(token2);
      int len = Length();
      if ( len >= len1 )
      {
        // in-place
        ON_SimpleArray<int> n(32);
        const wchar_t* s = m_s;
        int i;
        for ( i = 0; i <= len-len1; /*empty*/ )
        {
          if ( wcsncmp(s,token1,len1) )
          {
            s++;
            i++;
          }
          else
          {
            n.Append(i);
            i += len1;
            s += len1;
          }
        }

        count = n.Count();

        // reserve array space - must be done even when len2 <= len1
        // so that shared arrays are not corrupted.
        const int newlen = len + (count*(len2-len1));
        if ( 0 == newlen )
        {
          Destroy();
          return count;
        }

        CopyArray();

        // 24 August 2006 Dale Lear
        //    This used to say
        //       ReserveArray(newlen);
        //    but when newlen < len and the string had multiple
        //    references, the ReserveArray(newlen) call truncated
        //    the input array.
        if (nullptr == ReserveArray((newlen < len) ? len : newlen))
          return 0;

        int i0, i1, ni, j;

        if ( len2 > len1 )
        {
          // copy from back to front
          i1 = newlen;
          i0 = len;
          for ( ni =0; ni < count; ni++ )
            n[ni] = n[ni] + len1;
          for ( ni = count-1; ni >= 0; ni-- )
          {
            j = n[ni];
            while ( i0 > j )
            {
              i0--;
              i1--;
              m_s[i1] = m_s[i0];
            }
            i1 -= len2;
            i0 -= len1;
            memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
          }
        }
        else
        {
          // copy from front to back
          i0 = i1 = n[0];
          n.Append(len);
          for ( ni = 0; ni < count; ni++ )
          {
            if ( len2 > 0 )
            {
              memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
              i1 += len2;
            }
            i0 += len1;
            j = n[ni+1];
            while ( i0 < j )
            {
              m_s[i1++] = m_s[i0++];
            }
          }
        }
        Header()->string_length = newlen;
        m_s[newlen] = 0;
      }
    }
  }

  return count;
}